

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

int green_poller_release(green_poller_t poller)

{
  int iVar1;
  int local_1c;
  int i;
  green_poller_t poller_local;
  
  fprintf(_stderr,"green_poller_release()\n");
  if (poller == (green_poller_t)0x0) {
    poller_local._4_4_ = 1;
  }
  else {
    if (poller->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x1b9);
      fflush(_stderr);
      abort();
    }
    iVar1 = poller->refs + -1;
    poller->refs = iVar1;
    if (iVar1 == 0) {
      for (local_1c = 0; (ulong)(long)local_1c < poller->used; local_1c = local_1c + 1) {
        poller->futures[local_1c]->poller = (green_poller_t)0x0;
        poller->futures[local_1c]->slot = -1;
        green_future_release(poller->futures[local_1c]);
        poller->futures[local_1c] = (green_future_t)0x0;
      }
      green_free(poller->futures);
      poller->futures = (green_future_t *)0x0;
      poller->loop = (green_loop_t_conflict)0x0;
      green_free(poller);
    }
    poller_local._4_4_ = 0;
  }
  return poller_local._4_4_;
}

Assistant:

int green_poller_release(green_poller_t poller)
{
    fprintf(stderr, "green_poller_release()\n");

    if (poller == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(poller->refs > 0);
    if (--poller->refs == 0) {
        for (int i = 0; i < poller->used; ++i) {
            poller->futures[i]->poller = NULL;
            poller->futures[i]->slot = -1;
            green_future_release(poller->futures[i]);
            poller->futures[i] = NULL;
        }
        green_free(poller->futures);
        poller->futures = NULL;
        poller->loop = NULL;
        green_free(poller);
    }
    return GREEN_SUCCESS;
}